

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  _Base_ptr *pp_Var1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  iterator __position;
  pointer ppcVar4;
  cmGeneratorTarget *pcVar5;
  cmSourceFile *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  iterator iVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  string *psVar14;
  cmSourceGroup *this_01;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_02;
  iterator iVar15;
  _Base_ptr p_Var16;
  mapped_type *pmVar17;
  cmValue cVar18;
  cmGeneratedFileStream *pcVar19;
  ostream *poVar20;
  cmCustomCommand *pcVar21;
  long *plVar22;
  cmSourceFileLocation *pcVar23;
  _Base_ptr p_Var24;
  char *extraout_RDX;
  cmSourceFile *sourceFile;
  pointer ppcVar25;
  pointer __k;
  _Base_ptr p_Var26;
  vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>> avVar27 [8];
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __i;
  ulong uVar28;
  pointer ppcVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  cmGhsMultiTargetGenerator *pcVar31;
  long lVar32;
  bool bVar33;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar34;
  string objectName;
  string gname;
  string fext;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> gfiles;
  string lpath;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string fname_1;
  string fpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  string gn;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  cmSourceFile *sf;
  _Alloc_hider in_stack_fffffffffffff918;
  _Alloc_hider _Var35;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_stack_fffffffffffff920;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8 [2];
  _Base_ptr local_6b8;
  undefined1 local_6b0 [48];
  _Base_ptr local_680;
  _Base_ptr local_678;
  _Base_ptr local_670;
  _Base_ptr *local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_660 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_638;
  vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>> local_618 [8];
  iterator iStack_610;
  _Alloc_hider local_608;
  undefined1 local_600 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0 [2];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5d0;
  bool local_5b0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_5a8;
  _Base_ptr local_588;
  _Base_ptr *local_580;
  undefined1 local_578 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  string local_548;
  string local_528;
  string local_508;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  _Base_ptr local_4a8;
  _Base_ptr local_4a0;
  string local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  code *local_468;
  undefined8 uStack_460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  _Base_ptr *local_420;
  _Base_ptr local_418;
  _Base_ptr local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  undefined1 local_3f0 [16];
  _Base_ptr local_3e0;
  cmGeneratorTarget *pcStack_3d8;
  _Base_ptr local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  _Alloc_hider local_3c0;
  pointer local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  long *local_3a0 [2];
  long local_390 [55];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  local_1d8;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_1a8;
  undefined1 local_190 [352];
  
  local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_680 = (_Base_ptr)fout_proj;
  cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&local_5a8,&this->ConfigName);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&local_1a8,&this->Makefile->SourceGroups);
  ppcVar4 = local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4d8._M_impl.super__Rb_tree_header._M_header;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar25 = local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    do {
      local_190._0_8_ = *ppcVar25;
      pcVar2 = this->Makefile;
      psVar14 = cmSourceFile::ResolveFullPath
                          ((cmSourceFile *)local_190._0_8_,(string *)0x0,(string *)0x0);
      this_01 = cmMakefile::FindSourceGroup(pcVar2,psVar14,&local_1a8);
      psVar14 = cmSourceGroup::GetFullName_abi_cxx11_(this_01);
      pcVar3 = (psVar14->_M_dataplus)._M_p;
      local_440._0_8_ = local_430;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_440,pcVar3,pcVar3 + psVar14->_M_string_length);
      this_02 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_1d8,(key_type *)local_440);
      __position._M_current = *(cmSourceFile ***)(this_02 + 8);
      if (__position._M_current == *(cmSourceFile ***)(this_02 + 0x10)) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>(this_02,__position,(cmSourceFile **)local_190);
      }
      else {
        *__position._M_current = (cmSourceFile *)local_190._0_8_;
        *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_4d8,(key_type *)local_440);
      if ((undefined1 *)local_440._0_8_ != local_430) {
        operator_delete((void *)local_440._0_8_,local_430._0_8_ + 1);
      }
      ppcVar25 = ppcVar25 + 1;
    } while (ppcVar25 != ppcVar4);
  }
  local_440._0_8_ = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"CMake Rules","");
  local_420 = &local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"Header Files","");
  local_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Source Files","");
  local_3e0 = (_Base_ptr)&local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Object Files","");
  local_3c0._M_p = (pointer)&local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Object Libraries","");
  plVar22 = local_390;
  local_3a0[0] = plVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Resources","");
  __l._M_len = 6;
  __l._M_array = (iterator)local_440;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_458,__l,(allocator_type *)local_190);
  lVar32 = -0xc0;
  do {
    if (plVar22 != (long *)plVar22[-2]) {
      operator_delete((long *)plVar22[-2],*plVar22 + 1);
    }
    plVar22 = plVar22 + -4;
    lVar32 = lVar32 + 0x20;
  } while (lVar32 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_650,local_1d8._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)local_440);
  uVar28 = 0;
  if (local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __k = local_458.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_4d8,__k);
      iVar13 = (int)uVar28;
      if ((_Rb_tree_header *)iVar15._M_node == &local_4d8._M_impl.super__Rb_tree_header) {
        if ((this->TagType == CUSTOM_TARGET) &&
           (iVar12 = std::__cxx11::string::compare((char *)__k), iVar12 == 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_650,
                   ((long)local_650.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_650.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
          std::__cxx11::string::_M_assign
                    ((string *)
                     (local_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar13));
          goto LAB_002a56bf;
        }
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)
                   (local_650.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar13));
        pVar34 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range(&local_4d8,__k);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux(&local_4d8,(_Base_ptr)pVar34.first._M_node,(_Base_ptr)pVar34.second._M_node);
LAB_002a56bf:
        uVar28 = (ulong)(iVar13 + 1);
      }
      __k = __k + 1;
    } while (__k != local_458.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    uVar28 = (ulong)(int)uVar28;
  }
  local_440._8_8_ = (cmGeneratorTarget *)0x0;
  local_430._0_8_ = local_430._0_8_ & 0xffffffffffffff00;
  local_440._0_8_ = (cmGeneratedFileStream *)local_430;
  iVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_4d8,(key_type *)local_440);
  if ((_Rb_tree_header *)iVar15._M_node != &local_4d8._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (local_650.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    pVar34 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::equal_range(&local_4d8,(key_type *)local_440);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux(&local_4d8,(_Base_ptr)pVar34.first._M_node,(_Base_ptr)pVar34.second._M_node);
  }
  if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_430._0_8_ + 1));
  }
  p_Var24 = (_Base_ptr)
            local_650.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var26 = (_Base_ptr)
            local_650.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Rb_tree_header *)local_4d8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_4d8._M_impl.super__Rb_tree_header) {
    lVar32 = uVar28 << 5;
    p_Var16 = local_4d8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_650.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar32));
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      lVar32 = lVar32 + 0x20;
      p_Var24 = (_Base_ptr)
                local_650.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var26 = (_Base_ptr)
                local_650.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((_Rb_tree_header *)p_Var16 != &local_4d8._M_impl.super__Rb_tree_header);
  }
  for (; p_Var24 != p_Var26; p_Var24 = p_Var24 + 1) {
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&local_1d8,(key_type *)p_Var24);
    ppcVar4 = (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&local_1d8,(key_type *)p_Var24);
    ppcVar25 = (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar4 != ppcVar25) {
      uVar28 = (long)ppcVar25 - (long)ppcVar4 >> 3;
      lVar32 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar32 == 0; lVar32 = lVar32 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                (ppcVar4,ppcVar25,((uint)lVar32 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppcVar25 - (long)ppcVar4 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar4,ppcVar25);
      }
      else {
        ppcVar29 = ppcVar4 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar4,ppcVar29);
        for (; ppcVar29 != ppcVar25; ppcVar29 = ppcVar29 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar29);
        }
      }
    }
  }
  local_618 = (vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>  [8])0x0;
  iStack_610._M_current = (cmGeneratedFileStream **)0x0;
  local_608._M_p = (pointer)0x0;
  local_4a8 = (_Base_ptr)
              local_650.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  p_Var26 = (_Base_ptr)
            local_650.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  avVar27 = local_618;
  iVar6._M_current = iStack_610._M_current;
  if (local_650.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_650.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar5 = this->GeneratorTarget;
      local_440._0_8_ = (cmGeneratedFileStream *)local_430;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_440,"GHS_NO_SOURCE_GROUP_FILE","");
      cVar18 = cmGeneratorTarget::GetProperty(pcVar5,(string *)local_440);
      if (cVar18.Value == (string *)0x0) {
        bVar10 = false;
      }
      else {
        value._M_str = extraout_RDX;
        value._M_len = (size_t)((cVar18.Value)->_M_dataplus)._M_p;
        bVar10 = cmValue::IsOn((cmValue *)(cVar18.Value)->_M_string_length,value);
      }
      bVar11 = true;
      if (bVar10 == false) {
        pcVar2 = this->Makefile;
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_528,"CMAKE_GHS_NO_SOURCE_GROUP_FILE","");
        bVar11 = cmMakefile::IsOn(pcVar2,&local_528);
      }
      if ((bVar10 == false) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2)) {
        operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
      }
      local_6b8 = p_Var26;
      if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
        operator_delete((void *)local_440._0_8_,(ulong)(local_430._0_8_ + 1));
      }
      p_Var26 = local_680;
      if ((bVar11 == false) && (local_6b8->_M_parent != (_Base_ptr)0x0)) {
        local_6b0._0_8_ = local_6b0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6b0,*(long *)local_6b8,
                   (long)&local_6b8->_M_parent->_M_color + *(long *)local_6b8);
        cmsys::SystemTools::ReplaceString((string *)local_6b0,"\\","_");
        uVar9 = local_6b0._8_8_;
        uVar8 = local_6b0._0_8_;
        pcVar7 = cmGlobalGhsMultiGenerator::FILE_EXTENSION;
        local_430._0_8_ = strlen(cmGlobalGhsMultiGenerator::FILE_EXTENSION);
        local_440._0_8_ = uVar9;
        local_440._8_8_ = uVar8;
        local_430._8_8_ = pcVar7;
        views._M_len = 2;
        views._M_array = (iterator)local_440;
        cmCatViews_abi_cxx11_((string *)local_600,views);
        pcVar31 = this;
        psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                            (&this->LocalGenerator->super_cmLocalGenerator);
        pcVar5 = (cmGeneratorTarget *)(psVar14->_M_dataplus)._M_p;
        pcVar3 = (pointer)psVar14->_M_string_length;
        in_stack_fffffffffffff918._M_p = &DAT_00000001;
        in_stack_fffffffffffff920 = local_6d8;
        local_6d8[0]._M_local_buf[0] = '/';
        (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                  (&local_670,this->LocalGenerator,this->GeneratorTarget);
        local_420 = local_668;
        local_418 = local_670;
        local_190._0_8_ = &DAT_00000001;
        local_408 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_190 + 0x10);
        local_190[0x10] = '/';
        local_410 = (_Base_ptr)&DAT_00000001;
        local_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_600._8_8_;
        local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_600._0_8_;
        views_00._M_len = 5;
        views_00._M_array = (iterator)local_440;
        local_440._0_8_ = pcVar3;
        local_440._8_8_ = pcVar5;
        local_430._0_8_ = in_stack_fffffffffffff918._M_p;
        local_430._8_8_ = in_stack_fffffffffffff920;
        local_190._8_8_ = local_408;
        cmCatViews_abi_cxx11_(&local_508,views_00);
        this = pcVar31;
        if (local_670 != (_Base_ptr)local_660) {
          operator_delete(local_670,(ulong)((long)local_660[0] + 1));
          this = pcVar31;
        }
        pcVar19 = (cmGeneratedFileStream *)operator_new(0x268);
        cmGeneratedFileStream::cmGeneratedFileStream(pcVar19,&local_508,false,None);
        local_440._0_8_ = pcVar19;
        cmGeneratedFileStream::SetCopyIfDifferent(pcVar19,true);
        if (iStack_610._M_current == (cmGeneratedFileStream **)local_608._M_p) {
          std::vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>::
          _M_realloc_insert<cmGeneratedFileStream*const&>
                    (local_618,iStack_610,(cmGeneratedFileStream **)local_440);
        }
        else {
          *iStack_610._M_current = (cmGeneratedFileStream *)local_440._0_8_;
          iStack_610._M_current = iStack_610._M_current + 1;
        }
        p_Var26 = (_Base_ptr)local_440._0_8_;
        cmGlobalGhsMultiGenerator::WriteFileHeader
                  ((cmGlobalGhsMultiGenerator *)
                   (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,
                   (ostream *)local_440._0_8_);
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_440._0_8_);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_680,(char *)local_600._0_8_,local_600._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_680);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,
                          CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                                   local_508.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._0_8_ != local_5f0) {
          operator_delete((void *)local_600._0_8_,
                          CONCAT71(local_5f0[0]._M_allocated_capacity._1_7_,
                                   local_5f0[0]._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_6b0._0_8_ != local_6b0 + 0x10) {
          operator_delete((void *)local_6b0._0_8_,local_6b0._16_8_ + 1);
        }
      }
      if (bVar11 == false) {
        if (local_6b8->_M_parent == (_Base_ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var26,"{comment} Others\n",0x11);
        }
      }
      else if (local_6b8->_M_parent == (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var26,"{comment} Others",0x10);
        local_440[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var26,local_440,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var26,"{comment} ",10);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)p_Var26,*(char **)local_6b8,(long)local_6b8->_M_parent);
        local_440[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_440,1);
      }
      p_Var24 = local_6b8;
      iVar13 = std::__cxx11::string::compare((char *)local_6b8);
      if (iVar13 == 0) {
        local_638.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_638.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_638.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar10 = ComputeCustomCommandOrder(this,&local_638);
        p_Var24 = (_Base_ptr)
                  local_638.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (bVar10) {
          psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_190,"The custom commands for target [",psVar14);
          plVar22 = (long *)std::__cxx11::string::append((char *)local_190);
          pcVar19 = (cmGeneratedFileStream *)(plVar22 + 2);
          if ((cmGeneratedFileStream *)*plVar22 == pcVar19) {
            local_430._0_8_ =
                 (pcVar19->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream;
            local_430._8_8_ = plVar22[3];
            local_440._0_8_ = (cmGeneratedFileStream *)local_430;
          }
          else {
            local_430._0_8_ =
                 (pcVar19->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream;
            local_440._0_8_ = (cmGeneratedFileStream *)*plVar22;
          }
          local_440._8_8_ = plVar22[1];
          *plVar22 = (long)pcVar19;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
            operator_delete((void *)local_190._0_8_,CONCAT71(local_190._17_7_,local_190[0x10]) + 1);
          }
          cmSystemTools::Error((string *)local_440);
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_430._0_8_;
          p_Var24 = (_Base_ptr)local_440._0_8_;
          if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
LAB_002a67d8:
            operator_delete(p_Var24,(ulong)((long)paVar30 + 1));
          }
        }
        else {
          for (; p_Var24 !=
                 (_Base_ptr)
                 local_638.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish; p_Var24 = (_Base_ptr)&p_Var24->_M_parent
              ) {
            pcVar23 = cmSourceFile::GetLocation(*(cmSourceFile **)p_Var24);
            pcVar3 = (this->Name)._M_dataplus._M_p;
            local_440._0_8_ = (cmGeneratedFileStream *)local_430;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_440,pcVar3,pcVar3 + (this->Name)._M_string_length);
            std::__cxx11::string::append((char *)local_440);
            pcVar5 = (cmGeneratorTarget *)(pcVar23->Name)._M_string_length;
            if (pcVar5 == (cmGeneratorTarget *)local_440._8_8_) {
              if (pcVar5 == (cmGeneratorTarget *)0x0) {
                bVar10 = true;
              }
              else {
                iVar13 = bcmp((pcVar23->Name)._M_dataplus._M_p,(void *)local_440._0_8_,
                              (size_t)pcVar5);
                bVar10 = iVar13 == 0;
              }
            }
            else {
              bVar10 = false;
            }
            if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
              operator_delete((void *)local_440._0_8_,(ulong)(local_430._0_8_ + 1));
            }
            if (bVar10) {
              std::_V2::
              __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                        (p_Var24,&p_Var24->_M_parent,
                         local_638.
                         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              break;
            }
          }
          local_670 = (_Base_ptr)local_660;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,".sh","");
          local_4a0 = (_Base_ptr)
                      local_638.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (local_638.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_638.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            iVar13 = 0;
            p_Var24 = (_Base_ptr)
                      local_638.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_678 = p_Var24;
              pcVar21 = cmSourceFile::GetCustomCommand(*(cmSourceFile **)p_Var24);
              local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
              pcVar3 = (this->ConfigName)._M_dataplus._M_p;
              pcVar31 = this;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_548,pcVar3,pcVar3 + (this->ConfigName)._M_string_length);
              local_5b0 = false;
              local_478 = 0;
              uStack_470 = 0;
              local_468 = (code *)0x0;
              uStack_460 = 0;
              computeInternalDepfile.super__Function_base._M_functor._8_8_ = pcVar31;
              computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object =
                   &local_478;
              computeInternalDepfile.super__Function_base._M_manager =
                   (_Manager_type)in_stack_fffffffffffff918._M_p;
              computeInternalDepfile._M_invoker = (_Invoker_type)in_stack_fffffffffffff920;
              cmCustomCommandGenerator::cmCustomCommandGenerator
                        ((cmCustomCommandGenerator *)local_190,pcVar21,&local_548,
                         &this->LocalGenerator->super_cmLocalGenerator,true,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_5d0,computeInternalDepfile);
              if (local_468 != (code *)0x0) {
                (*local_468)(&local_478,&local_478,3);
              }
              if ((local_5b0 == true) &&
                 (local_5b0 = false,
                 local_5d0._M_value._M_dataplus._M_p !=
                 (_Alloc_hider)((long)&local_5d0._M_value + 0x10))) {
                operator_delete((void *)local_5d0._M_value._M_dataplus._M_p,local_5d0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p != &local_548.field_2) {
                operator_delete(local_548._M_dataplus._M_p,
                                local_548.field_2._M_allocated_capacity + 1);
              }
              this = pcVar31;
              psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                  (&pcVar31->LocalGenerator->super_cmLocalGenerator);
              pcVar5 = (cmGeneratorTarget *)(psVar14->_M_dataplus)._M_p;
              pcVar19 = (cmGeneratedFileStream *)psVar14->_M_string_length;
              local_508._M_dataplus._M_p = &DAT_00000001;
              local_508._M_string_length = (size_type)&local_508.field_2;
              local_508.field_2._M_local_buf[0] = '/';
              (*(pcVar31->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                        (&local_588,pcVar31->LocalGenerator,pcVar31->GeneratorTarget);
              pcVar23 = cmSourceFile::GetLocation(*(cmSourceFile **)local_678);
              local_430._0_8_ = local_508._M_dataplus._M_p;
              local_430._8_8_ = local_508._M_string_length;
              local_420 = local_580;
              local_418 = local_588;
              in_stack_fffffffffffff918._M_p = &DAT_00000001;
              in_stack_fffffffffffff920 = local_6d8;
              local_6d8[0]._M_local_buf[0] = '/';
              local_410 = (_Base_ptr)&DAT_00000001;
              local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(this->Name)._M_dataplus._M_p;
              local_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(this->Name)._M_string_length;
              local_3f0._0_8_ = 3;
              local_3f0._8_8_ = "_cc";
              local_440._0_8_ = pcVar19;
              local_440._8_8_ = pcVar5;
              local_408 = in_stack_fffffffffffff920;
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_6b0,iVar13);
              local_3e0 = (_Base_ptr)local_6b0._0_8_;
              pcStack_3d8 = (cmGeneratorTarget *)local_6b0._8_8_;
              local_600._0_8_ = &DAT_00000001;
              local_600._8_8_ = local_5f0;
              local_5f0[0]._M_local_buf[0] = '_';
              local_3d0 = (_Base_ptr)&DAT_00000001;
              local_3b8 = (pcVar23->Name)._M_dataplus._M_p;
              local_3c0._M_p = (pointer)(pcVar23->Name)._M_string_length;
              local_3b0._M_allocated_capacity = (size_type)local_668;
              local_3b0._8_8_ = local_670;
              views_01._M_len = 10;
              views_01._M_array = (iterator)local_440;
              local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_600._8_8_;
              cmCatViews_abi_cxx11_((string *)(local_578 + 0x10),views_01);
              if (local_588 != (_Base_ptr)local_578) {
                operator_delete(local_588,local_578._0_8_ + 1);
              }
              cmGeneratedFileStream::cmGeneratedFileStream
                        ((cmGeneratedFileStream *)local_440,(string *)(local_578 + 0x10),false,None)
              ;
              cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_440,true);
              WriteCustomCommandsHelper
                        (this,(ostream *)local_440,(cmCustomCommandGenerator *)local_190);
              pcVar31 = (cmGhsMultiTargetGenerator *)local_440;
              cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_440);
              WriteCustomCommandLine
                        (pcVar31,(ostream *)p_Var26,(string *)(local_578 + 0x10),
                         (cmCustomCommandGenerator *)local_190);
              cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_440);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_578._16_8_ != &local_558) {
                operator_delete((void *)local_578._16_8_,local_558._M_allocated_capacity + 1);
              }
              cmCustomCommandGenerator::~cmCustomCommandGenerator
                        ((cmCustomCommandGenerator *)local_190);
              p_Var24 = (_Base_ptr)&local_678->_M_parent;
              iVar13 = iVar13 + 1;
            } while (p_Var24 != local_4a0);
          }
          paVar30 = local_660[0];
          p_Var24 = local_670;
          if (local_670 != (_Base_ptr)local_660) goto LAB_002a67d8;
        }
        if (this->TagType == CUSTOM_TARGET) {
          WriteBuildEvents(this,(ostream *)p_Var26);
        }
        if ((_Base_ptr)
            local_638.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
          operator_delete(local_638.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_638.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_638.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                                *)&local_1d8,(key_type *)p_Var24);
        p_Var24 = (_Base_ptr)
                  (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        local_678 = (_Base_ptr)
                    (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        if (p_Var24 != local_678) {
          do {
            this_00 = *(cmSourceFile **)p_Var24;
            psVar14 = cmSourceFile::GetFullPath_abi_cxx11_(this_00);
            pcVar3 = (psVar14->_M_dataplus)._M_p;
            local_440._0_8_ = (cmGeneratedFileStream *)local_430;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_440,pcVar3,pcVar3 + psVar14->_M_string_length);
            cmSystemTools::ConvertToOutputSlashes((string *)local_440);
            local_190._0_8_ = local_190 + 0x10;
            local_190._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_190[0x10] = '\0';
            bVar10 = this->TagType == CUSTOM_TARGET;
            if (bVar10) {
              cmSourceFile::GetLanguage_abi_cxx11_(&local_498,this_00);
              bVar33 = true;
              bVar11 = true;
              if (local_498._M_string_length == 0) goto LAB_002a5e73;
            }
            else {
LAB_002a5e73:
              pcVar21 = cmSourceFile::GetCustomCommand(this_00);
              bVar33 = pcVar21 != (cmCustomCommand *)0x0;
              bVar11 = bVar10;
            }
            if ((bVar11) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2)) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar33) {
              std::__cxx11::string::_M_replace((ulong)local_190,0,(char *)local_190._8_8_,0x6a53d4);
            }
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)p_Var26,(char *)local_190._0_8_,local_190._8_8_);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_440._0_8_,local_440._8_8_);
            WriteObjectLangOverride_abi_cxx11_
                      ((string *)&stack0xfffffffffffff918,(cmGhsMultiTargetGenerator *)this_00,
                       sourceFile);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,in_stack_fffffffffffff918._M_p,
                                 (long)in_stack_fffffffffffff920);
            local_6b0[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_6b0,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffff918._M_p != local_6d8) {
              operator_delete(in_stack_fffffffffffff918._M_p,
                              CONCAT71(local_6d8[0]._M_allocated_capacity._1_7_,
                                       local_6d8[0]._M_local_buf[0]) + 1);
            }
            pp_Var1 = (_Base_ptr *)(local_6b0 + 0x10);
            if (!bVar33) {
              _Var35._M_p = (pointer)local_6d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffff918,"INCLUDE_DIRECTORIES","");
              pcVar31 = (cmGhsMultiTargetGenerator *)local_6b0;
              local_6b0._0_8_ = pp_Var1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"-I","");
              WriteSourceProperty(pcVar31,(ostream *)p_Var26,this_00,
                                  (string *)&stack0xfffffffffffff918,(string *)local_6b0);
              if ((_Base_ptr *)local_6b0._0_8_ != pp_Var1) {
                operator_delete((void *)local_6b0._0_8_,local_6b0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var35._M_p != local_6d8) {
                operator_delete(_Var35._M_p,
                                CONCAT71(local_6d8[0]._M_allocated_capacity._1_7_,
                                         local_6d8[0]._M_local_buf[0]) + 1);
              }
              _Var35._M_p = (pointer)local_6d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffff918,"COMPILE_DEFINITIONS","");
              pcVar31 = (cmGhsMultiTargetGenerator *)local_6b0;
              local_6b0._0_8_ = pp_Var1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"-D","");
              WriteSourceProperty(pcVar31,(ostream *)p_Var26,this_00,
                                  (string *)&stack0xfffffffffffff918,(string *)local_6b0);
              if ((_Base_ptr *)local_6b0._0_8_ != pp_Var1) {
                operator_delete((void *)local_6b0._0_8_,local_6b0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var35._M_p != local_6d8) {
                operator_delete(_Var35._M_p,
                                CONCAT71(local_6d8[0]._M_allocated_capacity._1_7_,
                                         local_6d8[0]._M_local_buf[0]) + 1);
              }
              _Var35._M_p = (pointer)local_6d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffff918,"COMPILE_OPTIONS","");
              pcVar31 = (cmGhsMultiTargetGenerator *)local_6b0;
              local_6b0._0_8_ = pp_Var1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"");
              WriteSourceProperty(pcVar31,(ostream *)p_Var26,this_00,
                                  (string *)&stack0xfffffffffffff918,(string *)local_6b0);
              if ((_Base_ptr *)local_6b0._0_8_ != pp_Var1) {
                operator_delete((void *)local_6b0._0_8_,local_6b0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var35._M_p != local_6d8) {
                operator_delete(_Var35._M_p,
                                CONCAT71(local_6d8[0]._M_allocated_capacity._1_7_,
                                         local_6d8[0]._M_local_buf[0]) + 1);
              }
              psVar14 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,this_00);
              in_stack_fffffffffffff918._M_p = (pointer)local_6d8;
              pcVar3 = (psVar14->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&stack0xfffffffffffff918,pcVar3,
                         pcVar3 + psVar14->_M_string_length);
              if ((in_stack_fffffffffffff920 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) &&
                 (bVar10 = cmGeneratorTarget::HasExplicitObjectName(this->GeneratorTarget,this_00),
                 bVar10)) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)p_Var26,"    -o ",7);
                poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)p_Var26,in_stack_fffffffffffff918._M_p,
                                     (long)in_stack_fffffffffffff920);
                local_6b0[0] = 10;
                std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_6b0,1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffff918._M_p != local_6d8) {
                operator_delete(in_stack_fffffffffffff918._M_p,
                                CONCAT71(local_6d8[0]._M_allocated_capacity._1_7_,
                                         local_6d8[0]._M_local_buf[0]) + 1);
              }
            }
            if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
              operator_delete((void *)local_190._0_8_,CONCAT71(local_190._17_7_,local_190[0x10]) + 1
                             );
            }
            if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
              operator_delete((void *)local_440._0_8_,(ulong)(local_430._0_8_ + 1));
            }
            p_Var24 = (_Base_ptr)&p_Var24->_M_parent;
          } while (p_Var24 != local_678);
        }
      }
      p_Var26 = local_6b8 + 1;
      avVar27 = local_618;
      iVar6._M_current = iStack_610._M_current;
    } while (local_6b8 + 1 != local_4a8);
  }
  for (; avVar27 !=
         (vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>  [8])
         iVar6._M_current;
      avVar27 = (vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>  [8])
                ((long)avVar27 + 8)) {
    cmGeneratedFileStream::Close(*(cmGeneratedFileStream **)avVar27);
  }
  if (local_618 != (vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>  [8])0x0)
  {
    operator_delete((void *)local_618,(long)local_608._M_p - (long)local_618);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_650);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::~_Rb_tree(&local_1d8);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_1a8);
  if (local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5a8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5a8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (cmSourceFile* sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->ResolveFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (const auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->ResolveFullPath() < r->ResolveFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      cmIsOn(this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE")) ||
      this->Makefile->IsOn("CMAKE_GHS_NO_SOURCE_GROUP_FILE");
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        cmStrCat(gname, cmGlobalGhsMultiGenerator::FILE_EXTENSION);
      std::string fpath = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget), '/',
        lpath);
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << '\n';
      } else {
        *fout << "{comment} " << sg << '\n';
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others\n";
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << WriteObjectLangOverride(si) << '\n';
        if (compile) {
          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << '\n';
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (this->ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
#ifdef _WIN32
        std::string fext = ".bat";
#else
        std::string fext = ".sh";
#endif
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname = cmStrCat(
            this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
            '/', this->Name, "_cc", cmdcount++, '_',
            (sf->GetLocation()).GetName(), fext);

          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}